

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::
construct_arr<2ul>(suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                   *this,bool fast_resolval)

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  pair<unsigned_int,_unsigned_int> pVar5;
  unsigned_long uVar6;
  ostream *poVar7;
  pointer paVar8;
  size_t i;
  unsigned_long *puVar9;
  long lVar10;
  undefined7 in_register_00000031;
  ulong uVar11;
  pair<unsigned_long,_unsigned_long> pVar12;
  allocator local_159;
  ulong local_158;
  suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
  *local_150;
  vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> tuples;
  string local_130;
  undefined4 local_10c;
  suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
  *local_108;
  section_timer looptimer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_B_SA;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cpy_SA;
  section_timer timer;
  
  local_10c = (undefined4)CONCAT71(in_register_00000031,fast_resolval);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  section_timer_impl(&timer,(ostream *)&std::cerr,*(MPI_Comm *)(this + 0x20),0);
  pVar5 = suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
          ::initial_bucketing((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                               *)this,0);
  std::__cxx11::string::string((string *)&looptimer,"initial-bucketing",(allocator *)&local_130);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            (&timer,(string *)&looptimer);
  std::__cxx11::string::~string((string *)&looptimer);
  local_150 = this + 0x90;
  if (*(long *)(this + 0x98) - *(long *)(this + 0x90) !=
      *(long *)(this + 0xb0) - *(long *)(this + 0xa8)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,
               *(long *)(this + 0xb0) - *(long *)(this + 0xa8) >> 3);
  }
  local_108 = this + 0xa8;
  local_B_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_B_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_B_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = (ulong)pVar5 & 0xffffffff;
  do {
    uVar2 = *(ulong *)(this + 8);
    local_158 = uVar11;
    if (uVar2 <= uVar11) goto LAB_00121e23;
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
    section_timer_impl(&looptimer,(ostream *)&std::cerr,*(MPI_Comm *)(this + 0x20),0);
    std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>::
    vector(&tuples,*(size_type *)(this + 0x10),(allocator_type *)&local_130);
    lVar3 = *(long *)(this + 0x80);
    lVar4 = *(long *)(this + 0xa8);
    puVar9 = (tuples.
              super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 1;
    for (uVar11 = 0; uVar11 < *(ulong *)(this + 0x10); uVar11 = uVar11 + 1) {
      ((array<unsigned_long,_3UL> *)(puVar9 + -1))->_M_elems[0] = lVar3 + uVar11;
      *puVar9 = *(unsigned_long *)(lVar4 + uVar11 * 8);
      puVar9 = puVar9 + 3;
    }
    std::__cxx11::string::string((string *)&local_130,"arr-tupelize",(allocator *)&cpy_SA);
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              (&looptimer,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::shift_buckets<2UL>
              ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                *)this,local_158,&tuples);
    std::__cxx11::string::string((string *)&local_130,"shift-buckets",(allocator *)&cpy_SA);
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              (&looptimer,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::sort_array_tuples<2UL>
              ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                *)this,&tuples);
    std::__cxx11::string::string((string *)&local_130,"ISA-to-SA",(allocator *)&cpy_SA);
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              (&looptimer,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    pVar12 = suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
             ::rebucket_arr<2UL>((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                                  *)this,&tuples,true);
    uVar6 = pVar12.first;
    if (*(int *)(this + 0x2c) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"iteration ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,": unfinished buckets = ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,", unfinished elements = ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::__cxx11::string::string((string *)&local_130,"rebucket",(allocator *)&cpy_SA);
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              (&looptimer,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    lVar3 = *(long *)local_150;
    paVar8 = tuples.
             super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar11 = 0; uVar11 < *(ulong *)(this + 0x10); uVar11 = uVar11 + 1) {
      *(unsigned_long *)(lVar3 + uVar11 * 8) = paVar8->_M_elems[0];
      paVar8 = paVar8 + 1;
    }
    if (tuples.
        super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        tuples.
        super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      tuples.
      super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           tuples.
           super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>::
    _M_shrink_to_fit(&tuples);
    std::__cxx11::string::string((string *)&local_130,"arr-untupelize",(allocator *)&cpy_SA);
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              (&looptimer,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    if (((char)local_10c != '\0') && (pVar12.second < *(ulong *)(this + 8) / 10)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&cpy_SA,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&local_B_SA,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
      suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
      ::reorder_sa_to_isa((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                           *)this,&cpy_SA);
      std::__cxx11::string::string((string *)&local_130,"SA-to-ISA",&local_159);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                (&looptimer,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&cpy_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      _Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
      ::~_Vector_base(&tuples.
                       super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                     );
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
      ~section_timer_impl(&looptimer);
      if (uVar6 == 0) goto LAB_00121e60;
      goto LAB_00121e23;
    }
    uVar11 = local_158 * 2;
    if (uVar6 == 0 || *(ulong *)(this + 8) <= uVar11) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&cpy_SA,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
      suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
      ::reorder_sa_to_isa((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                           *)this,&cpy_SA);
      std::__cxx11::string::string((string *)&local_130,"SA-to-ISA",&local_159);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                (&looptimer,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&cpy_SA);
    }
    else {
      suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
      ::reorder_sa_to_isa((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                           *)this);
      std::__cxx11::string::string((string *)&local_130,"SA-to-ISA",(allocator *)&cpy_SA);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                (&looptimer,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
    }
    std::__cxx11::string::string((string *)&local_130,"sac-iteration",(allocator *)&cpy_SA);
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              (&timer,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::
    _Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>::
    ~_Vector_base(&tuples.
                   super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                 );
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
    ~section_timer_impl(&looptimer);
  } while (uVar6 != 0);
  if (uVar2 <= local_158) {
LAB_00121e23:
    if (*(int *)(this + 0x2c) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Starting Bucket chasing algorithm");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::construct_msgs((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                      *)this,&local_B_SA,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
                     (int)local_158 * 2);
  }
LAB_00121e60:
  std::__cxx11::string::string((string *)&looptimer,"construct-msgs",(allocator *)&local_130);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            (&timer,(string *)&looptimer);
  std::__cxx11::string::~string((string *)&looptimer);
  lVar3 = *(long *)(this + 0xa8);
  lVar4 = *(long *)(this + 0xb0);
  for (lVar10 = 0; lVar4 - lVar3 >> 3 != lVar10; lVar10 = lVar10 + 1) {
    plVar1 = (long *)(lVar3 + lVar10 * 8);
    *plVar1 = *plVar1 + -1;
  }
  std::__cxx11::string::string((string *)&looptimer,"fix-isa",(allocator *)&local_130);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            (&timer,(string *)&looptimer);
  std::__cxx11::string::~string((string *)&looptimer);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_B_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  ~section_timer_impl(&timer);
  return;
}

Assistant:

void construct_arr(bool fast_resolval = true) {
    SAC_TIMER_START();

    /***********************
     *  Initial bucketing  *
     ***********************/

    // create initial k-mers and use these as the initial bucket numbers
    // for each character position
    // `k` depends on the alphabet size and the word size of each suffix array
    // element. `k` is choosen to maximize the number of alphabet characters
    // that fit into one machine word
    unsigned int k;
    unsigned int bits_per_char;
    std::tie(k, bits_per_char) = initial_bucketing();
    SAC_TIMER_END_SECTION("initial-bucketing");

    // init local_SA
    if (local_SA.size() != local_B.size()) {
        local_SA.resize(local_B.size());
    }

    std::vector<index_t> local_B_SA;
    std::size_t unfinished_buckets = 1<<k;
    std::size_t unfinished_elements = n;
    std::size_t shift_by;

    /*******************************
     *  Prefix Doubling main loop  *
     *******************************/
    for (shift_by = k; shift_by < n; shift_by*=L) {
        SAC_TIMER_LOOP_START();

        /*****************
         *  fill tuples  *
         *****************/
        std::vector<std::array<index_t, L+1> > tuples(local_size);
        std::size_t offset = part.excl_prefix_size();
        for (std::size_t i = 0; i < local_size; ++i) {
            tuples[i][0] = i + offset;
            tuples[i][1] = local_B[i];
        }
        SAC_TIMER_END_LOOP_SECTION(shift_by, "arr-tupelize");

        /**************************************************
         *  Pairing buckets by shifting `shift_by` = 2^k  *
         **************************************************/
        // shift the B1 buckets by 2^k to the left => equals B2
        shift_buckets<L>(shift_by, tuples);
        SAC_TIMER_END_LOOP_SECTION(shift_by, "shift-buckets");


        /*************
         *  ISA->SA  *
         *************/
        // by using sample sort on tuples (B1,B2)
        sort_array_tuples<L>(tuples);
        SAC_TIMER_END_LOOP_SECTION(shift_by, "ISA-to-SA");


        /****************
         *  Update LCP  *
         ****************/
        // if this is the first iteration: create LCP, otherwise update
        // TODO: LCP construciton is not (yet) implemented for std::array based construction
        /*
        if (_CONSTRUCT_LCP)
        {
            if (shift_by == k) {
                initial_kmer_lcp(k, bits_per_char, local_B2);
                SAC_TIMER_END_LOOP_SECTION(shift_by, "init-lcp");
            } else {
                resolve_next_lcp(shift_by, local_B2);
                SAC_TIMER_END_LOOP_SECTION(shift_by, "update-lcp");
            }
        }
        */

        /*******************************
         *  Assign new bucket numbers  *
         *******************************/
        std::tie(unfinished_buckets,unfinished_elements) = rebucket_arr<L>(tuples, true);
        if (comm.rank() == 0) {
            INFO("iteration " << shift_by << ": unfinished buckets = " << unfinished_buckets << ", unfinished elements = " << unfinished_elements);
        }
        SAC_TIMER_END_LOOP_SECTION(shift_by, "rebucket");


        /**************************************
         *  Reset local_SA array from tuples  *
         **************************************/
        for (std::size_t i = 0; i < local_size; ++i) {
            local_SA[i] = tuples[i][0];
        }

        // deallocate all memory
        tuples.clear();
        tuples.shrink_to_fit();
        SAC_TIMER_END_LOOP_SECTION(shift_by, "arr-untupelize");


        /*************
         *  SA->ISA  *
         *************/
        // by bucketing to correct target processor using the `SA` array

        if (fast_resolval && unfinished_elements < n/10) {
            // prepare for bucket chaising (needs SA, and bucket arrays in both
            // SA and ISA order)
            std::vector<index_t> cpy_SA(local_SA);
            local_B_SA = local_B; // copy
            reorder_sa_to_isa(cpy_SA);
            SAC_TIMER_END_LOOP_SECTION(shift_by, "SA-to-ISA");
            break;
        } else if ((shift_by * L) >= n || unfinished_buckets == 0) {
            // if last iteration, use copy of local_SA for reorder and keep
            // original SA
            std::vector<index_t> cpy_SA(local_SA);
            reorder_sa_to_isa(cpy_SA);
            SAC_TIMER_END_LOOP_SECTION(shift_by, "SA-to-ISA");
        } else {
            reorder_sa_to_isa();
            SAC_TIMER_END_LOOP_SECTION(shift_by, "SA-to-ISA");
        }

        // end iteratior
        SAC_TIMER_END_SECTION("sac-iteration");

        // check for termination condition
        if (unfinished_buckets == 0)
            break;
    }

    if (unfinished_buckets > 0) {
        if (comm.rank() == 0)
            INFO("Starting Bucket chasing algorithm");
        construct_msgs(local_B_SA, local_B, L*shift_by);
    }
    SAC_TIMER_END_SECTION("construct-msgs");

    // now local_SA is actual block decomposed SA and local_B is actual ISA with an offset of one
    for (std::size_t i = 0; i < local_B.size(); ++i) {
        // the buffer indeces are `1` based indeces, but the ISA should be
        // `0` based indeces
        local_B[i] -= 1;
    }
    SAC_TIMER_END_SECTION("fix-isa");
}